

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  format_specs *pfVar2;
  unsigned_type uVar3;
  int num_digits;
  string_view prefix;
  bin_writer<3> f;
  
  num_digits = count_digits<3u,unsigned_long>(this->abs_value);
  pfVar2 = this->specs;
  uVar3 = this->abs_value;
  if (((char)pfVar2->field_0x9 < '\0') && (uVar3 != 0 && pfVar2->precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  f.num_digits = num_digits;
  f.abs_value = uVar3;
  f._12_4_ = 0;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,*pfVar2,
             f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }